

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBSpStructMatrix.cpp
# Opt level: O0

TPZMatrix<std::complex<double>_> * __thiscall
TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::Create
          (TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_> *this
          )

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  long lVar7;
  TPZManVector<long,_10> *this_00;
  int64_t iVar8;
  int64_t iVar9;
  long *plVar10;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  complex<double> *pcVar15;
  long in_RDI;
  int64_t numactive_3;
  int64_t col_1;
  int64_t j_1;
  int64_t iclast_1;
  int64_t icfirst_1;
  int64_t jbleq;
  int64_t colpos_1;
  int64_t colsize_1;
  int64_t ibleq;
  int64_t numactive_2;
  int64_t iblpos_1;
  int64_t iblsize_1;
  complex<double> *EqValue;
  int64_t *EqCol;
  int64_t *Eq;
  int64_t pos;
  int64_t ieq;
  int64_t numactive_1;
  int64_t colpos;
  int64_t colsize;
  int64_t col;
  int64_t j;
  int64_t iclast;
  int64_t icfirst;
  int64_t numactive;
  int64_t iblpos;
  int64_t iblsize;
  int64_t totaleq;
  int64_t totalvar;
  int64_t nblock;
  int64_t i;
  TPZManVector<long,_10> nodegraphindex;
  TPZManVector<long,_10> nodegraph;
  TPZRenumbering metis;
  TPZVec<long> elgraphindex;
  TPZStack<long,_10> elgraph;
  TPZFYsmpMatrix<std::complex<double>_> *mat;
  int64_t neq;
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  TPZBlock *in_stack_fffffffffffffb80;
  TPZVec<long> *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  TPZBlock *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  int64_t in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  TPZFYsmpMatrix<std::complex<double>_> *in_stack_fffffffffffffbd0;
  TPZVec<long> *in_stack_fffffffffffffc10;
  complex<double> *this_01;
  TPZStack<long,_10> *in_stack_fffffffffffffc18;
  complex<double> *pcVar16;
  TPZCompMesh *in_stack_fffffffffffffc20;
  int64_t local_300;
  long local_2e8;
  long local_2d0;
  TPZManVector<long,_10> *in_stack_fffffffffffffd60;
  TPZManVector<long,_10> *in_stack_fffffffffffffd68;
  TPZVec<long> *in_stack_fffffffffffffd70;
  long lVar17;
  TPZVec<long> *in_stack_fffffffffffffd78;
  TPZRenumbering *in_stack_fffffffffffffd80;
  int64_t local_268;
  long local_238;
  long local_230;
  int64_t local_220;
  TPZVec<long> local_218 [3];
  TPZVec<long> local_1a8 [3];
  TPZRenumbering local_138;
  TPZVec<long> local_b8 [2];
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  
  lVar7 = (**(code **)(**(long **)(in_RDI + 8) + 0x98))();
  if (lVar7 != 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZSpStructMatrix should not be called with CreateAssemble for a substructure mesh\n"
                   );
    pzinternal::DebugStopImpl(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  TPZEquationFilter::NActiveEquations
            ((TPZEquationFilter *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  this_00 = (TPZManVector<long,_10> *)operator_new(0x3e0);
  TPZFYsmpMatrix<std::complex<double>_>::TPZFYsmpMatrix
            (in_stack_fffffffffffffbd0,CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
             ,in_stack_fffffffffffffbc0);
  TPZStack<long,_10>::TPZStack
            ((TPZStack<long,_10> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  TPZVec<long>::TPZVec(local_b8);
  TPZCompMesh::ComputeElGraph
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  TPZRenumbering::TPZRenumbering
            ((TPZRenumbering *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  iVar8 = TPZVec<long>::NElements(local_b8);
  iVar9 = TPZCompMesh::NIndependentConnects
                    ((TPZCompMesh *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  TPZRenumbering::SetElementsNodes(&local_138,iVar8 + -1,iVar9);
  TPZRenumbering::SetElementGraph
            ((TPZRenumbering *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
             in_stack_fffffffffffffb88,(TPZVec<long> *)in_stack_fffffffffffffb80);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
             ,(int64_t)in_stack_fffffffffffffb98);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
             ,(int64_t)in_stack_fffffffffffffb98);
  TPZRenumbering::ConvertGraph
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  iVar8 = TPZVec<long>::NElements(local_218);
  local_230 = 0;
  local_238 = 0;
  for (local_220 = 0; local_220 < iVar8 + -1; local_220 = local_220 + 1) {
    TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
    iVar5 = TPZBlock::Size(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
    lVar7 = (long)iVar5;
    TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
    TPZBlock::Position(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
    iVar9 = TPZEquationFilter::NumActive
                      ((TPZEquationFilter *)in_stack_fffffffffffffb98,
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       (int64_t)in_stack_fffffffffffffb88);
    if (iVar9 != 0) {
      if (iVar9 != lVar7) {
        pzinternal::DebugStopImpl(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      local_238 = local_238 + lVar7;
      plVar10 = TPZVec<long>::operator[](local_218,local_220);
      local_268 = *plVar10;
      plVar10 = TPZVec<long>::operator[](local_218,local_220 + 1);
      lVar17 = *plVar10;
      local_230 = lVar7 * lVar7 + local_230;
      for (; local_268 < lVar17; local_268 = local_268 + 1) {
        TPZVec<long>::operator[](local_1a8,local_268);
        TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
        iVar5 = TPZBlock::Size(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
        TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
        TPZBlock::Position(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
        iVar9 = TPZEquationFilter::NumActive
                          ((TPZEquationFilter *)in_stack_fffffffffffffb98,
                           CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                           (int64_t)in_stack_fffffffffffffb88);
        if (iVar9 != 0) {
          local_230 = lVar7 * iVar5 + local_230;
        }
      }
    }
  }
  lVar17 = 0;
  lVar7 = 0;
  iVar8 = TPZCompMesh::NIndependentConnects
                    ((TPZCompMesh *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_238 + 1;
  uVar11 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar12 = operator_new__(uVar11);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_230 / 2;
  uVar11 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar11);
  uVar11 = local_230 / 2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar11;
  uVar14 = SUB168(auVar4 * ZEXT816(0x10),0);
  if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  pcVar15 = (complex<double> *)operator_new__(uVar14);
  if (uVar11 != 0) {
    pcVar16 = pcVar15 + uVar11;
    this_01 = pcVar15;
    do {
      std::complex<double>::complex(this_01,0.0,0.0);
      this_01 = this_01 + 1;
    } while (this_01 != pcVar16);
  }
  for (local_220 = 0; local_220 < iVar8; local_220 = local_220 + 1) {
    TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
    iVar5 = TPZBlock::Size(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
    TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
    TPZBlock::Position(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
    iVar9 = TPZEquationFilter::NumActive
                      ((TPZEquationFilter *)in_stack_fffffffffffffb98,
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       (int64_t)in_stack_fffffffffffffb88);
    if (iVar9 != 0) {
      for (local_2d0 = 0; local_2d0 < iVar5; local_2d0 = local_2d0 + 1) {
        *(long *)((long)pvVar12 + lVar17 * 8) = lVar7;
        if (lVar17 % 2 == 0) {
          TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
          iVar6 = TPZBlock::Size(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
          TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
          TPZBlock::Position(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
          for (local_2e8 = 0; local_2e8 < iVar6; local_2e8 = local_2e8 + 1) {
            *(undefined8 *)((long)pvVar13 + lVar7 * 8) = 0xffffffffffffffff;
            std::complex<double>::operator=(pcVar15 + lVar7,0.0);
            lVar7 = lVar7 + 1;
          }
          plVar10 = TPZVec<long>::operator[](local_218,local_220);
          local_300 = *plVar10;
          plVar10 = TPZVec<long>::operator[](local_218,local_220 + 1);
          lVar1 = *plVar10;
          for (; local_300 < lVar1; local_300 = local_300 + 1) {
            TPZVec<long>::operator[](local_1a8,local_300);
            TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
            iVar6 = TPZBlock::Size(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
            in_stack_fffffffffffffb98 = TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
            in_stack_fffffffffffffb94 =
                 TPZBlock::Position(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
            in_stack_fffffffffffffb88 =
                 (TPZVec<long> *)
                 TPZEquationFilter::NumActive
                           ((TPZEquationFilter *)in_stack_fffffffffffffb98,
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            (int64_t)in_stack_fffffffffffffb88);
            if (in_stack_fffffffffffffb88 != (TPZVec<long> *)0x0) {
              for (local_2e8 = 0; local_2e8 < iVar6; local_2e8 = local_2e8 + 1) {
                *(undefined8 *)((long)pvVar13 + lVar7 * 8) = 0xffffffffffffffff;
                std::complex<double>::operator=(pcVar15 + lVar7,0.0);
                lVar7 = lVar7 + 1;
              }
            }
          }
        }
        lVar17 = lVar17 + 1;
      }
    }
  }
  *(long *)((long)pvVar12 + lVar17 * 8) = lVar7;
  (*(this_00->super_TPZVec<long>)._vptr_TPZVec[0x50])(this_00,pvVar12,pvVar13,pcVar15);
  TPZManVector<long,_10>::~TPZManVector(this_00);
  TPZManVector<long,_10>::~TPZManVector(this_00);
  TPZRenumbering::~TPZRenumbering((TPZRenumbering *)0x1dfde7f);
  TPZVec<long>::~TPZVec(&this_00->super_TPZVec<long>);
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1dfde99);
  return (TPZMatrix<std::complex<double>_> *)this_00;
}

Assistant:

TPZMatrix<TVar> * TPZBSpStructMatrix<TVar,TPar>::Create(){
    //checked
    if(this->fMesh->FatherMesh()) {
		PZError << "TPZSpStructMatrix should not be called with CreateAssemble for a substructure mesh\n";
        DebugStop();
    }
    int64_t neq = this->fEquationFilter.NActiveEquations();
    TPZFYsmpMatrix<TVar> * mat = new TPZFYsmpMatrix<TVar>(neq,neq);
	
    /**Rearange elements order*/
	//    TPZVec<int> elorder(fMesh->NEquations(),0);
	
	
    /**
     *Longhin implementation
	 */
    TPZStack<int64_t> elgraph;
    TPZVec<int64_t> elgraphindex;
	//    int nnodes = 0;
    this->fMesh->ComputeElGraph(elgraph,elgraphindex);
    /**Creates a element graph*/
    TPZRenumbering metis;
    metis.SetElementsNodes(elgraphindex.NElements() -1 ,this->fMesh->NIndependentConnects());
    metis.SetElementGraph(elgraph,elgraphindex);
	
    TPZManVector<int64_t> nodegraph;
    TPZManVector<int64_t> nodegraphindex;
    /**
     *converts an element graph structure into a node graph structure
     *those vectors have size ZERO !!!
     */
    metis.ConvertGraph(elgraph,elgraphindex,nodegraph,nodegraphindex);
    /**vector sizes*/
    int64_t i;
    int64_t nblock = nodegraphindex.NElements()-1;
    int64_t totalvar = 0;
    int64_t totaleq = 0;
    for(i=0;i<nblock;i++){
		int64_t iblsize = this->fMesh->Block().Size(i);
		int64_t iblpos = this->fMesh->Block().Position(i);
        int64_t numactive = this->fEquationFilter.NumActive(iblpos, iblpos+iblsize);
        if (!numactive) {
            continue;
        }
        if (numactive != iblsize) {
            DebugStop();
        }
		totaleq += iblsize;
		int64_t icfirst = nodegraphindex[i];
		int64_t iclast = nodegraphindex[i+1];
		int64_t j;
		//longhin
		totalvar+=iblsize*iblsize;
		for(j=icfirst;j<iclast;j++) {
			int64_t col = nodegraph[j];
			int64_t colsize = this->fMesh->Block().Size(col);
			int64_t colpos = this->fMesh->Block().Position(col);
            int64_t numactive = this->fEquationFilter.NumActive(colpos, colpos+colsize);
            if (!numactive) {
                continue;
            }
			totalvar += iblsize*colsize;
		}
    }
	
    int64_t ieq = 0;
    int64_t pos = 0;
	
    nblock=this->fMesh->NIndependentConnects();
	
    int64_t * Eq = new int64_t[totaleq+1];
    int64_t * EqCol = new int64_t[totalvar/2];
    TVar * EqValue = new TVar[totalvar/2];
    for(i=0;i<nblock;i++){
		int64_t iblsize = this->fMesh->Block().Size(i);
		int64_t iblpos = this->fMesh->Block().Position(i);
        int64_t numactive = this->fEquationFilter.NumActive(iblpos, iblpos+iblsize);
        if (!numactive) {
            continue;
        }
		int64_t ibleq;
		for(ibleq=0; ibleq<iblsize; ibleq++) {
			Eq[ieq] = pos;
			if(ieq%2) {
				ieq++;
				continue;
			}
			int64_t colsize = this->fMesh->Block().Size(i);
			int64_t colpos = this->fMesh->Block().Position(i);
			int64_t jbleq;
			for(jbleq=0; jbleq<colsize; jbleq++) {
				/**It can also be implemented using half the size of both columns and data vectors*/
				EqCol[pos] = -1;//colpos;
				EqValue[pos] = 0.;
				colpos++;
				pos++;
			}
			
			int64_t icfirst = nodegraphindex[i];
			int64_t iclast = nodegraphindex[i+1];
			int64_t j;
			for(j=icfirst;j<iclast;j++) {
				int64_t col = nodegraph[j];
				colsize = this->fMesh->Block().Size(col);
				colpos = this->fMesh->Block().Position(col);
                int64_t numactive = this->fEquationFilter.NumActive(colpos, colpos+colsize);
                if (!numactive) {
                    continue;
                }
                for(jbleq=0; jbleq<colsize; jbleq++) {
					EqCol[pos] = -1;//colpos;
					EqValue[pos] = 0.;
					colpos++;
					pos++;
				}
			}
			ieq++;
		}
    }
    Eq[ieq] = pos;
	/*    for(i=0;i<totalvar;i++){
	 if(i<totaleq+1){
	 cout << i <<  " " << Eq[i] << " "<< EqCol[i] << " " << EqValue[i] << endl;
	 }else{
	 cout << i <<  " " << " "<< EqCol[i] << " " << EqValue[i] << endl;
	 }
	 }
	 */
    mat->SetData(Eq,EqCol,EqValue);
    return mat;
}